

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

int vector_reserve(vector v,size_t capacity)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 1;
  if ((v != (vector)0x0) && (v->capacity != capacity)) {
    uVar3 = 0x10;
    if (0x10 < capacity) {
      uVar3 = capacity;
    }
    pvVar1 = realloc(v->data,v->type_size * uVar3);
    if (pvVar1 == (void *)0x0) {
      log_write_impl_va("metacall",0xa5,"vector_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reallocation error");
    }
    else {
      if (uVar3 < v->size) {
        v->size = uVar3;
      }
      v->data = pvVar1;
      v->capacity = uVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int vector_reserve(vector v, size_t capacity)
{
	if (v != NULL && capacity != v->capacity)
	{
		register void *data;

		if (capacity < VECTOR_CAPACITY_MIN)
		{
			capacity = VECTOR_CAPACITY_MIN;
		}

		data = realloc(v->data, capacity * v->type_size);

		if (data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector reallocation error");

			return 1;
		}

		if (capacity < v->size)
		{
			v->size = capacity;
		}

		v->data = data;

		v->capacity = capacity;

		return 0;
	}

	return 1;
}